

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O3

bool tinyusdz::pathutil::ResolveRelativePath
               (Path *base_prim_path,Path *relative_path,Path *abs_path,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  string relative_str;
  string remainder;
  string abs_dir;
  string base_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_dirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  Path local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Path *local_40;
  Path *local_38;
  
  if (abs_path == (Path *)0x0) {
    return false;
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar3 = (relative_path->_prim_part)._M_dataplus._M_p;
  local_38 = relative_path;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar3,pcVar3 + (relative_path->_prim_part)._M_string_length);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar3 = (base_prim_path->_prim_part)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (base_prim_path->_prim_part)._M_string_length);
  local_148._prim_part._M_dataplus._M_p = (pointer)&local_148._prim_part.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"/","");
  _Var4._M_p = local_148._prim_part._M_dataplus._M_p;
  if (local_78._M_string_length < local_148._prim_part._M_string_length) {
    bVar11 = false;
  }
  else if (local_148._prim_part._M_string_length == 0) {
    bVar11 = true;
  }
  else {
    iVar5 = bcmp(local_148._prim_part._M_dataplus._M_p,local_78._M_dataplus._M_p,
                 local_148._prim_part._M_string_length);
    bVar11 = iVar5 == 0;
  }
  paVar2 = &local_148._prim_part.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar2) {
    operator_delete(_Var4._M_p,
                    CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                      CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                               local_148._prim_part.field_2._M_allocated_capacity.
                                               _0_2_))) + 1);
  }
  if (!bVar11) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar11 = false;
    goto LAB_001df587;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
  local_40 = abs_path;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"./","");
  _Var4._M_p = local_148._prim_part._M_dataplus._M_p;
  if (local_1c8._M_string_length < local_148._prim_part._M_string_length) {
    bVar11 = false;
  }
  else if (local_148._prim_part._M_string_length == 0) {
    bVar11 = true;
  }
  else {
    iVar5 = bcmp(local_148._prim_part._M_dataplus._M_p,local_1c8._M_dataplus._M_p,
                 local_148._prim_part._M_string_length);
    bVar11 = iVar5 == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar2) {
    operator_delete(_Var4._M_p,
                    CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                      CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                               local_148._prim_part.field_2._M_allocated_capacity.
                                               _0_2_))) + 1);
  }
  if (bVar11) {
joined_r0x001df489:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
LAB_001df56b:
    bVar11 = false;
  }
  else {
    local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"../","");
    _Var4._M_p = local_148._prim_part._M_dataplus._M_p;
    if (local_1c8._M_string_length < local_148._prim_part._M_string_length) {
      bVar11 = false;
    }
    else if (local_148._prim_part._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = bcmp(local_148._prim_part._M_dataplus._M_p,local_1c8._M_dataplus._M_p,
                   local_148._prim_part._M_string_length);
      bVar11 = iVar5 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar2) {
      operator_delete(_Var4._M_p,
                      CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                        CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                 local_148._prim_part.field_2._M_allocated_capacity.
                                                 _0_2_))) + 1);
    }
    if (!bVar11) {
      local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,".","");
      _Var4._M_p = local_148._prim_part._M_dataplus._M_p;
      if (local_1c8._M_string_length < local_148._prim_part._M_string_length) {
        bVar11 = false;
      }
      else if (local_148._prim_part._M_string_length == 0) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp(local_148._prim_part._M_dataplus._M_p,local_1c8._M_dataplus._M_p,
                     local_148._prim_part._M_string_length);
        bVar11 = iVar5 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4._M_p != paVar2) {
        operator_delete(_Var4._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
      if (!bVar11) {
        local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"/","");
        _Var4._M_p = local_148._prim_part._M_dataplus._M_p;
        if (local_1c8._M_string_length < local_148._prim_part._M_string_length) {
          bVar11 = false;
        }
        else if (local_148._prim_part._M_string_length == 0) {
          bVar11 = true;
        }
        else {
          iVar5 = bcmp(local_148._prim_part._M_dataplus._M_p,local_1c8._M_dataplus._M_p,
                       local_148._prim_part._M_string_length);
          bVar11 = iVar5 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var4._M_p != paVar2) {
          operator_delete(_Var4._M_p,
                          CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                            CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                     local_148._prim_part.field_2.
                                                     _M_allocated_capacity._0_2_))) + 1);
        }
        if (bVar11) {
          ::std::__cxx11::string::_M_assign((string *)&local_168);
        }
        else {
          ::std::operator+(&local_1a8,&local_78,"/");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_148,&local_1a8,&local_1c8);
          ::std::__cxx11::string::operator=((string *)&local_168,(string *)&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
            operator_delete(local_148._prim_part._M_dataplus._M_p,
                            CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                     CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                              CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                       local_148._prim_part.field_2.
                                                       _M_allocated_capacity._0_2_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            local_188.field_2._M_allocated_capacity =
                 CONCAT44(local_1a8.field_2._M_allocated_capacity._4_4_,
                          CONCAT13(local_1a8.field_2._M_local_buf[3],
                                   CONCAT12(local_1a8.field_2._M_local_buf[2],
                                            local_1a8.field_2._M_allocated_capacity._0_2_)));
            _Var8._M_p = local_1a8._M_dataplus._M_p;
            goto LAB_001df6e7;
          }
        }
        goto LAB_001df6ef;
      }
      goto joined_r0x001df489;
    }
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_1c8._M_dataplus._M_p,
               local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
    paVar1 = &local_1a8.field_2;
    uVar9 = 0;
    do {
      local_148._prim_part.field_2._M_local_buf[2] = '/';
      local_148._prim_part.field_2._M_allocated_capacity._0_2_ = 0x2e2e;
      local_148._prim_part._M_string_length = 3;
      local_148._prim_part.field_2._M_local_buf[3] = '\0';
      if ((local_188._M_string_length < 3) ||
         ((char)*(short *)(local_188._M_dataplus._M_p + 2) != '/' ||
          *(short *)local_188._M_dataplus._M_p != 0x2e2e)) break;
      local_1a8.field_2._M_local_buf[2] = '/';
      local_1a8.field_2._M_allocated_capacity._0_2_ = 0x2e2e;
      local_1a8._M_string_length = 3;
      local_1a8.field_2._M_local_buf[3] = '\0';
      if ((char)*(short *)(local_188._M_dataplus._M_p + 2) == '/' &&
          *(short *)local_188._M_dataplus._M_p == 0x2e2e) {
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
        local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_188);
      }
      else {
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
        local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_188._M_dataplus._M_p,
                   local_188._M_dataplus._M_p + local_188._M_string_length);
      }
      ::std::__cxx11::string::operator=((string *)&local_188,(string *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT44(local_1a8.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_1a8.field_2._M_local_buf[3],
                                          CONCAT12(local_1a8.field_2._M_local_buf[2],
                                                   local_1a8.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < 0x100000 || local_188._M_string_length != 0);
    local_148._prim_part._M_dataplus._M_p = (pointer)&local_148._prim_part.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,".","");
    lVar6 = ::std::__cxx11::string::find
                      ((char *)&local_188,(ulong)local_148._prim_part._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                        CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                 local_148._prim_part.field_2._M_allocated_capacity.
                                                 _0_2_))) + 1);
    }
    if (lVar6 != -1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_001df1e8:
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001df56b;
    }
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"/","");
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar6 = 0x147ae15;
    uVar7 = 0;
    do {
      uVar7 = ::std::__cxx11::string::find_first_not_of
                        ((char *)&local_78,(ulong)local_1a8._M_dataplus._M_p,uVar7);
      if (uVar7 == 0xffffffffffffffff) break;
      uVar7 = ::std::__cxx11::string::find
                        ((char *)&local_78,(ulong)local_1a8._M_dataplus._M_p,uVar7);
      ::std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_78);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      CONCAT44(local_1a8.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_1a8.field_2._M_local_buf[3],
                                        CONCAT12(local_1a8.field_2._M_local_buf[2],
                                                 local_1a8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((long)local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_148,"/",&local_188);
      ::std::__cxx11::string::operator=((string *)&local_168,(string *)&local_148);
LAB_001df6a6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
    }
    else {
      lVar6 = ((long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - uVar9;
      if (lVar6 < -1) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::append((char *)err);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_001df1e8;
        goto LAB_001df56b;
      }
      if (lVar6 < 1) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_148,"/",&local_188);
        ::std::__cxx11::string::_M_append
                  ((char *)&local_168,(ulong)local_148._prim_part._M_dataplus._M_p);
        goto LAB_001df6a6;
      }
      lVar10 = 0;
      do {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_148,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_58.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar10));
        ::std::__cxx11::string::_M_append
                  ((char *)&local_168,(ulong)local_148._prim_part._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
          operator_delete(local_148._prim_part._M_dataplus._M_p,
                          CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                            CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                     local_148._prim_part.field_2.
                                                     _M_allocated_capacity._0_2_))) + 1);
        }
        lVar10 = lVar10 + 0x20;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_148,"/",&local_188);
      ::std::__cxx11::string::_M_append
                ((char *)&local_168,(ulong)local_148._prim_part._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
        operator_delete(local_148._prim_part._M_dataplus._M_p,
                        CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                          CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                   local_148._prim_part.field_2.
                                                   _M_allocated_capacity._0_2_))) + 1);
      }
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    _Var8._M_p = local_188._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_001df6e7:
      operator_delete(_Var8._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
LAB_001df6ef:
    Path::Path(&local_148,&local_168,(string *)&local_38->_prop_part);
    Path::operator=(local_40,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._element._M_dataplus._M_p != &local_148._element.field_2) {
      operator_delete(local_148._element._M_dataplus._M_p,
                      local_148._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part_str._M_dataplus._M_p != &local_148._variant_part_str.field_2) {
      operator_delete(local_148._variant_part_str._M_dataplus._M_p,
                      local_148._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_selection_part._M_dataplus._M_p !=
        &local_148._variant_selection_part.field_2) {
      operator_delete(local_148._variant_selection_part._M_dataplus._M_p,
                      local_148._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part._M_dataplus._M_p != &local_148._variant_part.field_2) {
      operator_delete(local_148._variant_part._M_dataplus._M_p,
                      local_148._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prop_part._M_dataplus._M_p != &local_148._prop_part.field_2) {
      operator_delete(local_148._prop_part._M_dataplus._M_p,
                      local_148._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      CONCAT44(local_148._prim_part.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_148._prim_part.field_2._M_local_buf[3],
                                        CONCAT12(local_148._prim_part.field_2._M_local_buf[2],
                                                 local_148._prim_part.field_2._M_allocated_capacity.
                                                 _0_2_))) + 1);
    }
    bVar11 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
LAB_001df587:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool ResolveRelativePath(const Path &base_prim_path, const Path &relative_path, Path *abs_path, std::string *err) {

  if (!abs_path) {
    return false;
  }

  std::string relative_str = relative_path.prim_part();
  std::string base_str = base_prim_path.prim_part();

  // base_prim_path must be absolute.
  if (startsWith(base_str, "/")) {
    // ok
  } else {
    if (err) {
      (*err) += "Base Prim path is not absolute path.\n";
    }
    return false;
  }

  std::string abs_dir;

  if (startsWith(relative_str, "./")) {
    // pxrUSD doesn't allow "./", so do same in tinyusdz.
#if 1
    if (err) {
      (*err) += "Path starting with `./` is not allowed.\n";
    }
    return false;
#else
    std::string remainder = removePrefix(relative_str, "./");

    // "./../", "././", etc is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      return false;
    }

    abs_dir = base_str + "/" + remainder;
#endif

  } else if (startsWith(relative_str, "../")) {
    // ok
    size_t ndepth{0};
    std::string remainder = RemoveRelativePrefix(relative_str, ndepth);
    DCOUT("remainder = " << remainder << ", ndepth = " << ndepth);

    // "../" in subsequent position(e.g. `../bora/../dora`) is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      if (err) {
        (*err) += "`../` in the middle of Path is not allowed.\n";
      }
      return false;
    }

    std::vector<std::string> base_dirs = split(base_str, "/");
    DCOUT("base_dirs.len = " << base_dirs.size());
    //if (base_dirs.size() < ndepth) {
    //  return false;
    //}

    if (base_dirs.size() == 0) { // "/"
      abs_dir = "/" + remainder;
    } else {
      int64_t n = int64_t(base_dirs.size()) - int64_t(ndepth);

#if 1
      // pxrUSD behavior
      if (n < -1) {
        if (err) {
          (*err) += "The number of `../` exceeds Prim path depth.\n";
        }
        return false;
      }
#else
      // Unixish path behavior
#endif
      if (n <= 0) {
        abs_dir += "/" + remainder;
      } else {
        for (size_t i = 0; i < size_t(n); i++) {
          abs_dir += "/" + base_dirs[i];
        }
        abs_dir += "/" + remainder;
      }
    }
  } else if (startsWith(relative_str, ".")) {
    // Property path?
    if (err) {
      (*err) += "A path starting with `.` is not allowed for Prim path.\n";
    }
    return false;
  } else if (startsWith(relative_str, "/")) {
    // Input path is already absolute.
    abs_dir = relative_str;
  } else {
    // Guess relative path(e.g. "muda", "bora/dora")
    // TODO: Check Path contains valid characters.
    abs_dir = base_str + "/" + relative_str;
  }

  (*abs_path) = Path(abs_dir, relative_path.prop_part());

  return true;
}